

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

bool __thiscall Clasp::Solver::pushRoot(Solver *this,Literal x)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  Literal local_14;
  
  if ((this->conflict_).ebo_.size == 0) {
    if ((this->levels_).super_type.ebo_.size != (this->levels_).root) {
      popRootLevel(this,0,(LitVec *)0x0,true);
    }
    if ((this->assign_).trail.ebo_.size != (this->assign_).front) {
      bVar2 = propagate(this);
      if (!bVar2) goto LAB_001698cc;
    }
    bVar3 = *(byte *)((long)(this->assign_).assign_.ebo_.buf + (ulong)(x.rep_ & 0xfffffffc)) & 3;
    if (bVar3 == 0) {
      assume(this,&local_14);
      (this->stats).super_CoreStats.choices = (this->stats).super_CoreStats.choices - 1;
      uVar1 = (this->levels_).super_type.ebo_.size;
      uVar4 = (this->levels_).root + 1;
      if (uVar1 <= uVar4) {
        uVar4 = uVar1;
      }
      (this->levels_).root = uVar4;
      uVar1 = *(uint *)&(this->levels_).field_0x14;
      uVar5 = uVar1 & 0x3fffffff;
      if (uVar5 <= uVar4) {
        uVar5 = uVar4;
      }
      *(uint *)&(this->levels_).field_0x14 = uVar1 & 0xc0000000 | uVar5 & 0x3fffffff;
      bVar2 = propagate(this);
      return bVar2;
    }
    bVar2 = bVar3 == (byte)(2U - ((x.rep_ & 2) == 0));
  }
  else {
LAB_001698cc:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Solver::pushRoot(Literal x) {
	if (hasConflict())                 { return false; }
	if (decisionLevel()!= rootLevel()) { popRootLevel(0);  }
	if (queueSize() && !propagate())   { return false;    }
	if (value(x.var()) != value_free)  { return isTrue(x);}
	assume(x); --stats.choices;
	pushRootLevel();
	return propagate();
}